

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-2.c
# Opt level: O0

int feederBig1(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint local_1c;
  int T;
  uint i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%d\n",1000);
    fprintf(__stream,"2000000\n");
    for (local_1c = 0; local_1c < 2000000; local_1c = local_1c + 1) {
      iVar1 = fprintf(__stream,"%d ",(ulong)(local_1c ^ 0xcafecafe));
      if (iVar1 < 0) {
        printf("can\'t create in.txt. No space on disk?\n");
        fclose(__stream);
        return -1;
      }
    }
    fprintf(__stream,"\n");
    fclose(__stream);
    sVar2 = GetLabPointerSize();
    LabMemoryLimit = (sVar2 * 2 + 8) * 2000000 + 0x400000;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig1(void)
{
    FILE *const in = fopen("in.txt", "w+");
    unsigned i;
    int T = 1000;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", T);
    fprintf(in, "2000000\n");
    for (i = 0; i < 2000000; i++) {
        if (fprintf(in, "%d ", i^0xcafecafe) < 0) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "\n");
    fclose(in);
    LabMemoryLimit = 2000000*(sizeof(int)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
    return 0;
}